

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string_n.hpp
# Opt level: O3

void __thiscall dna_string_n::build_rank_support(dna_string_n *this)

{
  uint8_t *puVar1;
  pointer ppVar2;
  undefined3 uVar3;
  undefined5 uVar4;
  undefined7 uVar5;
  unkbyte9 Var6;
  undefined1 auVar7 [11];
  undefined1 auVar8 [11];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong *puVar24;
  uint64_t uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ushort uVar34;
  long lVar38;
  undefined1 auVar40 [12];
  undefined1 auVar43 [16];
  uint64_t uVar45;
  uint64_t uVar46;
  uint64_t uVar47;
  uint64_t uVar48;
  long lVar49;
  long lVar50;
  undefined1 auVar51 [12];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  char cVar65;
  byte bVar77;
  char cVar78;
  byte bVar79;
  char cVar80;
  byte bVar81;
  char cVar82;
  byte bVar83;
  char cVar84;
  byte bVar85;
  undefined1 auVar66 [12];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [12];
  undefined1 auVar89 [16];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar96 [16];
  undefined4 uVar35;
  undefined6 uVar36;
  undefined8 uVar37;
  undefined1 auVar39 [12];
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar44 [16];
  undefined1 auVar52 [14];
  undefined1 auVar54 [16];
  undefined1 auVar67 [12];
  undefined1 auVar68 [14];
  undefined1 auVar69 [14];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar88 [14];
  undefined1 auVar90 [16];
  undefined1 auVar93 [14];
  undefined1 auVar94 [14];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  
  auVar15 = _DAT_001160d0;
  auVar14 = _DAT_001160c0;
  auVar13 = _DAT_001160b0;
  if (this->n_blocks == 1) {
    uVar23 = 0;
    uVar25 = 0;
    uVar45 = 0;
    uVar46 = 0;
    uVar47 = 0;
    uVar48 = 0;
  }
  else {
    puVar1 = this->data;
    ppVar2 = (this->superblock_ranks).super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar23 = 0;
    uVar25 = 0;
    lVar26 = 0;
    uVar28 = 0;
    lVar21 = 0;
    uVar45 = 0;
    uVar46 = 0;
    uVar47 = 0;
    uVar48 = 0;
    lVar49 = 0;
    lVar50 = 0;
    do {
      uVar16 = uVar23 >> 0x19;
      if ((uVar23 & 0x1ffffff) == 0) {
        ppVar2[uVar16].A = uVar45;
        ppVar2[uVar16].C = uVar46;
        ppVar2[uVar16].G = uVar47;
        (&ppVar2[uVar16].G)[1] = uVar48;
        ppVar2[uVar16].T = uVar25;
        lVar38 = uVar16 * 0x80000000;
        *(undefined1 (*) [16])(puVar1 + lVar38 + 0x30) = (undefined1  [16])0x0;
        lVar49 = 0;
        lVar50 = 0;
        lVar21 = 0;
        uVar28 = 0;
        lVar26 = 0;
      }
      else {
        uVar20 = (ulong)(uint)((int)(uVar23 & 0x1ffffff) << 6);
        *(ulong *)(puVar1 + uVar20 + 0x30 + uVar16 * 0x80000000) = CONCAT44((int)lVar50,(int)lVar49)
        ;
        *(int *)(puVar1 + uVar20 + 0x38 + uVar16 * 0x80000000) = (int)lVar21;
        *(int *)(puVar1 + uVar20 + 0x3c + uVar16 * 0x80000000) = (int)lVar26;
        *(ulong *)(puVar1 + uVar20 + uVar16 * 0x80000000) =
             *(long *)(puVar1 + uVar20 + uVar16 * 0x80000000) + (uVar28 & 0x7ff);
        *(ulong *)(puVar1 + uVar20 + 0x10 + uVar16 * 0x80000000) =
             *(long *)(puVar1 + uVar20 + 0x10 + uVar16 * 0x80000000) +
             (ulong)((uint)(uVar28 >> 0xb) & 0x7ff);
        lVar38 = uVar20 + uVar16 * 0x80000000;
        *(ulong *)(puVar1 + uVar20 + 0x20 + uVar16 * 0x80000000) =
             *(long *)(puVar1 + uVar20 + 0x20 + uVar16 * 0x80000000) + (uVar28 >> 0x16 & 0x7ff);
      }
      puVar24 = (ulong *)(puVar1 + lVar38);
      uVar16 = *puVar24;
      uVar20 = puVar24[1];
      uVar30 = ~puVar24[4] & 0xfffffffffffff800;
      uVar17 = ~puVar24[5];
      uVar33 = uVar30 & puVar24[2];
      uVar27 = ~puVar24[2] & 0xfffffffffffff800;
      uVar30 = uVar30 & uVar27;
      uVar31 = uVar30 & uVar16;
      uVar32 = uVar17 & puVar24[3];
      uVar22 = ~puVar24[3];
      uVar17 = uVar17 & uVar22;
      uVar30 = uVar30 & ~uVar16;
      uVar18 = uVar17 & uVar20;
      uVar17 = uVar17 & ~uVar20;
      uVar27 = uVar27 & puVar24[4] & uVar16;
      uVar22 = uVar22 & uVar20 & puVar24[5];
      uVar29 = ~uVar16 & uVar33;
      uVar19 = ~uVar20 & uVar32;
      uVar33 = uVar33 & uVar16;
      uVar32 = uVar32 & uVar20;
      auVar59._0_2_ = (ushort)uVar17 >> 1;
      auVar59._2_2_ = (ushort)(uVar17 >> 0x10) >> 1;
      auVar59._4_2_ = (ushort)(uVar17 >> 0x20) >> 1;
      auVar59._6_2_ = (ushort)(uVar17 >> 0x31);
      auVar59._8_2_ = (ushort)uVar18 >> 1;
      auVar59._10_2_ = (ushort)(uVar18 >> 0x10) >> 1;
      auVar59._12_2_ = (ushort)(uVar18 >> 0x20) >> 1;
      auVar59._14_2_ = (ushort)(uVar18 >> 0x31);
      auVar59 = auVar59 & auVar13;
      uVar34 = CONCAT11((char)(uVar17 >> 8) - auVar59[1],(char)uVar17 - auVar59[0]);
      uVar35 = CONCAT13((char)(uVar17 >> 0x18) - auVar59[3],
                        CONCAT12((char)(uVar17 >> 0x10) - auVar59[2],uVar34));
      uVar36 = CONCAT15((char)(uVar17 >> 0x28) - auVar59[5],
                        CONCAT14((char)(uVar17 >> 0x20) - auVar59[4],uVar35));
      uVar37 = CONCAT17((char)(uVar17 >> 0x38) - auVar59[7],
                        CONCAT16((char)(uVar17 >> 0x30) - auVar59[6],uVar36));
      auVar66._0_10_ =
           CONCAT19((char)(uVar18 >> 8) - auVar59[9],CONCAT18((char)uVar18 - auVar59[8],uVar37));
      auVar66[10] = (char)(uVar18 >> 0x10) - auVar59[10];
      auVar66[0xb] = (char)(uVar18 >> 0x18) - auVar59[0xb];
      auVar68[0xc] = (char)(uVar18 >> 0x20) - auVar59[0xc];
      auVar68._0_12_ = auVar66;
      auVar68[0xd] = (char)(uVar18 >> 0x28) - auVar59[0xd];
      auVar70[0xe] = (char)(uVar18 >> 0x30) - auVar59[0xe];
      auVar70._0_14_ = auVar68;
      auVar70[0xf] = (char)(uVar18 >> 0x38) - auVar59[0xf];
      auVar60 = auVar70 & auVar14;
      auVar71._0_2_ = uVar34 >> 2;
      auVar71._2_2_ = (ushort)((uint)uVar35 >> 0x12);
      auVar71._4_2_ = (ushort)((uint6)uVar36 >> 0x22);
      auVar71._6_2_ = (ushort)((ulong)uVar37 >> 0x32);
      auVar71._8_2_ = (ushort)((unkuint10)auVar66._0_10_ >> 0x42);
      auVar71._10_2_ = auVar66._10_2_ >> 2;
      auVar71._12_2_ = auVar68._12_2_ >> 2;
      auVar71._14_2_ = auVar70._14_2_ >> 2;
      auVar71 = auVar71 & auVar14;
      cVar65 = auVar71[0] + auVar60[0];
      bVar77 = auVar71[1] + auVar60[1];
      uVar34 = CONCAT11(bVar77,cVar65);
      cVar78 = auVar71[2] + auVar60[2];
      bVar79 = auVar71[3] + auVar60[3];
      uVar35 = CONCAT13(bVar79,CONCAT12(cVar78,uVar34));
      cVar80 = auVar71[4] + auVar60[4];
      bVar81 = auVar71[5] + auVar60[5];
      uVar36 = CONCAT15(bVar81,CONCAT14(cVar80,uVar35));
      cVar82 = auVar71[6] + auVar60[6];
      bVar83 = auVar71[7] + auVar60[7];
      uVar37 = CONCAT17(bVar83,CONCAT16(cVar82,uVar36));
      cVar84 = auVar71[8] + auVar60[8];
      bVar85 = auVar71[9] + auVar60[9];
      auVar67._0_10_ = CONCAT19(bVar85,CONCAT18(cVar84,uVar37));
      auVar67[10] = auVar71[10] + auVar60[10];
      auVar67[0xb] = auVar71[0xb] + auVar60[0xb];
      auVar69[0xc] = auVar71[0xc] + auVar60[0xc];
      auVar69._0_12_ = auVar67;
      auVar69[0xd] = auVar71[0xd] + auVar60[0xd];
      auVar72[0xe] = auVar71[0xe] + auVar60[0xe];
      auVar72._0_14_ = auVar69;
      auVar72[0xf] = auVar71[0xf] + auVar60[0xf];
      auVar86[0] = (char)(uVar34 >> 4) + cVar65;
      auVar86[1] = (bVar77 >> 4) + bVar77;
      auVar86[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar78;
      auVar86[3] = (bVar79 >> 4) + bVar79;
      auVar86[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar80;
      auVar86[5] = (bVar81 >> 4) + bVar81;
      auVar86[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar82;
      auVar86[7] = (bVar83 >> 4) + bVar83;
      auVar86[8] = (char)(ushort)((unkuint10)auVar67._0_10_ >> 0x44) + cVar84;
      auVar86[9] = (bVar85 >> 4) + bVar85;
      auVar86[10] = (char)(auVar67._10_2_ >> 4) + auVar67[10];
      auVar86[0xb] = (auVar67[0xb] >> 4) + auVar67[0xb];
      auVar86[0xc] = (char)(auVar69._12_2_ >> 4) + auVar69[0xc];
      auVar86[0xd] = (auVar69[0xd] >> 4) + auVar69[0xd];
      auVar86[0xe] = (char)(auVar72._14_2_ >> 4) + auVar72[0xe];
      auVar86[0xf] = (auVar72[0xf] >> 4) + auVar72[0xf];
      auVar61._0_2_ = (ushort)uVar30 >> 1;
      auVar61._2_2_ = (ushort)(uVar30 >> 0x10) >> 1;
      auVar61._4_2_ = (ushort)(uVar30 >> 0x20) >> 1;
      auVar61._6_2_ = (ushort)(uVar30 >> 0x31);
      auVar61._8_2_ = (ushort)uVar31 >> 1;
      auVar61._10_2_ = (ushort)(uVar31 >> 0x10) >> 1;
      auVar61._12_2_ = (ushort)(uVar31 >> 0x20) >> 1;
      auVar61._14_2_ = (ushort)(uVar31 >> 0x31);
      auVar61 = auVar61 & auVar13;
      bVar77 = (char)(uVar30 >> 8) - auVar61[1];
      uVar3 = CONCAT12((char)(uVar30 >> 0x18) - auVar61[3],
                       CONCAT11((char)(uVar30 >> 0x10) - auVar61[2],bVar77));
      uVar4 = CONCAT14((char)(uVar30 >> 0x28) - auVar61[5],
                       CONCAT13((char)(uVar30 >> 0x20) - auVar61[4],uVar3));
      uVar5 = CONCAT16((char)(uVar30 >> 0x38) - auVar61[7],
                       CONCAT15((char)(uVar30 >> 0x30) - auVar61[6],uVar4));
      Var6 = CONCAT18((char)(uVar31 >> 8) - auVar61[9],CONCAT17(-auVar61[8],uVar5));
      auVar7[9] = (char)(uVar31 >> 0x10) - auVar61[10];
      auVar7._0_9_ = Var6;
      auVar7[10] = (char)(uVar31 >> 0x18) - auVar61[0xb];
      auVar9[0xb] = (char)(uVar31 >> 0x20) - auVar61[0xc];
      auVar9._0_11_ = auVar7;
      auVar9[0xc] = (char)(uVar31 >> 0x28) - auVar61[0xd];
      auVar11[0xd] = (char)(uVar31 >> 0x30) - auVar61[0xe];
      auVar11._0_13_ = auVar9;
      auVar11[0xe] = (char)(uVar31 >> 0x38) - auVar61[0xf];
      auVar60[0xf] = 0;
      auVar60._0_15_ = auVar11;
      auVar60 = auVar60 << 8 & auVar14;
      auVar53._0_2_ = (ushort)((ushort)bVar77 << 8) >> 2;
      auVar53._2_2_ = (ushort)((uint3)uVar3 >> 10);
      auVar53._4_2_ = (ushort)((uint5)uVar4 >> 0x1a);
      auVar53._6_2_ = (ushort)((uint7)uVar5 >> 0x2a);
      auVar53._8_2_ = (ushort)((unkuint9)Var6 >> 0x3a);
      auVar53._10_2_ = auVar7._9_2_ >> 2;
      auVar53._12_2_ = auVar9._11_2_ >> 2;
      auVar53._14_2_ = auVar11._13_2_ >> 2;
      auVar53 = auVar53 & auVar14;
      bVar77 = auVar53[1] + auVar60[1];
      uVar34 = CONCAT11(bVar77,auVar53[0]);
      cVar65 = auVar53[2] + auVar60[2];
      bVar79 = auVar53[3] + auVar60[3];
      uVar35 = CONCAT13(bVar79,CONCAT12(cVar65,uVar34));
      cVar78 = auVar53[4] + auVar60[4];
      bVar81 = auVar53[5] + auVar60[5];
      uVar36 = CONCAT15(bVar81,CONCAT14(cVar78,uVar35));
      cVar80 = auVar53[6] + auVar60[6];
      bVar83 = auVar53[7] + auVar60[7];
      uVar37 = CONCAT17(bVar83,CONCAT16(cVar80,uVar36));
      cVar82 = auVar53[8] + auVar60[8];
      bVar85 = auVar53[9] + auVar60[9];
      auVar51._0_10_ = CONCAT19(bVar85,CONCAT18(cVar82,uVar37));
      auVar51[10] = auVar53[10] + auVar60[10];
      auVar51[0xb] = auVar53[0xb] + auVar60[0xb];
      auVar52[0xc] = auVar53[0xc] + auVar60[0xc];
      auVar52._0_12_ = auVar51;
      auVar52[0xd] = auVar53[0xd] + auVar60[0xd];
      auVar54[0xe] = auVar53[0xe] + auVar60[0xe];
      auVar54._0_14_ = auVar52;
      auVar54[0xf] = auVar53[0xf] + auVar60[0xf];
      auVar62[0] = (char)(uVar34 >> 4) + auVar53[0];
      auVar62[1] = (bVar77 >> 4) + bVar77;
      auVar62[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar65;
      auVar62[3] = (bVar79 >> 4) + bVar79;
      auVar62[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar78;
      auVar62[5] = (bVar81 >> 4) + bVar81;
      auVar62[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar80;
      auVar62[7] = (bVar83 >> 4) + bVar83;
      auVar62[8] = (char)(ushort)((unkuint10)auVar51._0_10_ >> 0x44) + cVar82;
      auVar62[9] = (bVar85 >> 4) + bVar85;
      auVar62[10] = (char)(auVar51._10_2_ >> 4) + auVar51[10];
      auVar62[0xb] = (auVar51[0xb] >> 4) + auVar51[0xb];
      auVar62[0xc] = (char)(auVar52._12_2_ >> 4) + auVar52[0xc];
      auVar62[0xd] = (auVar52[0xd] >> 4) + auVar52[0xd];
      auVar62[0xe] = (char)(auVar54._14_2_ >> 4) + auVar54[0xe];
      auVar62[0xf] = (auVar54[0xf] >> 4) + auVar54[0xf];
      auVar86 = auVar86 & auVar15;
      auVar62 = auVar62 & auVar15;
      auVar63[0] = auVar62[0] + auVar86[0];
      auVar63[1] = auVar62[1] + auVar86[1];
      auVar63[2] = auVar62[2] + auVar86[2];
      auVar63[3] = auVar62[3] + auVar86[3];
      auVar63[4] = auVar62[4] + auVar86[4];
      auVar63[5] = auVar62[5] + auVar86[5];
      auVar63[6] = auVar62[6] + auVar86[6];
      auVar63[7] = auVar62[7] + auVar86[7];
      auVar63[8] = auVar62[8] + auVar86[8];
      auVar63[9] = auVar62[9] + auVar86[9];
      auVar63[10] = auVar62[10] + auVar86[10];
      auVar63[0xb] = auVar62[0xb] + auVar86[0xb];
      auVar63[0xc] = auVar62[0xc] + auVar86[0xc];
      auVar63[0xd] = auVar62[0xd] + auVar86[0xd];
      auVar63[0xe] = auVar62[0xe] + auVar86[0xe];
      auVar63[0xf] = auVar62[0xf] + auVar86[0xf];
      auVar55._0_2_ = (ushort)uVar19 >> 1;
      auVar55._2_2_ = (ushort)(uVar19 >> 0x10) >> 1;
      auVar55._4_2_ = (ushort)(uVar19 >> 0x20) >> 1;
      auVar55._6_2_ = (ushort)(uVar19 >> 0x31);
      auVar55._8_2_ = (ushort)uVar22 >> 1;
      auVar55._10_2_ = (ushort)(uVar22 >> 0x10) >> 1;
      auVar55._12_2_ = (ushort)(uVar22 >> 0x20) >> 1;
      auVar55._14_2_ = (ushort)(uVar22 >> 0x31);
      auVar55 = auVar55 & auVar13;
      uVar34 = CONCAT11((char)(uVar19 >> 8) - auVar55[1],(char)uVar19 - auVar55[0]);
      uVar35 = CONCAT13((char)(uVar19 >> 0x18) - auVar55[3],
                        CONCAT12((char)(uVar19 >> 0x10) - auVar55[2],uVar34));
      uVar36 = CONCAT15((char)(uVar19 >> 0x28) - auVar55[5],
                        CONCAT14((char)(uVar19 >> 0x20) - auVar55[4],uVar35));
      uVar37 = CONCAT17((char)(uVar19 >> 0x38) - auVar55[7],
                        CONCAT16((char)(uVar19 >> 0x30) - auVar55[6],uVar36));
      auVar91._0_10_ =
           CONCAT19((char)(uVar22 >> 8) - auVar55[9],CONCAT18((char)uVar22 - auVar55[8],uVar37));
      auVar91[10] = (char)(uVar22 >> 0x10) - auVar55[10];
      auVar91[0xb] = (char)(uVar22 >> 0x18) - auVar55[0xb];
      auVar93[0xc] = (char)(uVar22 >> 0x20) - auVar55[0xc];
      auVar93._0_12_ = auVar91;
      auVar93[0xd] = (char)(uVar22 >> 0x28) - auVar55[0xd];
      auVar95[0xe] = (char)(uVar22 >> 0x30) - auVar55[0xe];
      auVar95._0_14_ = auVar93;
      auVar95[0xf] = (char)(uVar22 >> 0x38) - auVar55[0xf];
      auVar60 = auVar95 & auVar14;
      auVar96._0_2_ = uVar34 >> 2;
      auVar96._2_2_ = (ushort)((uint)uVar35 >> 0x12);
      auVar96._4_2_ = (ushort)((uint6)uVar36 >> 0x22);
      auVar96._6_2_ = (ushort)((ulong)uVar37 >> 0x32);
      auVar96._8_2_ = (ushort)((unkuint10)auVar91._0_10_ >> 0x42);
      auVar96._10_2_ = auVar91._10_2_ >> 2;
      auVar96._12_2_ = auVar93._12_2_ >> 2;
      auVar96._14_2_ = auVar95._14_2_ >> 2;
      auVar96 = auVar96 & auVar14;
      cVar65 = auVar96[0] + auVar60[0];
      bVar77 = auVar96[1] + auVar60[1];
      uVar34 = CONCAT11(bVar77,cVar65);
      cVar78 = auVar96[2] + auVar60[2];
      bVar79 = auVar96[3] + auVar60[3];
      uVar35 = CONCAT13(bVar79,CONCAT12(cVar78,uVar34));
      cVar80 = auVar96[4] + auVar60[4];
      bVar81 = auVar96[5] + auVar60[5];
      uVar36 = CONCAT15(bVar81,CONCAT14(cVar80,uVar35));
      cVar82 = auVar96[6] + auVar60[6];
      bVar83 = auVar96[7] + auVar60[7];
      uVar37 = CONCAT17(bVar83,CONCAT16(cVar82,uVar36));
      cVar84 = auVar96[8] + auVar60[8];
      bVar85 = auVar96[9] + auVar60[9];
      auVar92._0_10_ = CONCAT19(bVar85,CONCAT18(cVar84,uVar37));
      auVar92[10] = auVar96[10] + auVar60[10];
      auVar92[0xb] = auVar96[0xb] + auVar60[0xb];
      auVar94[0xc] = auVar96[0xc] + auVar60[0xc];
      auVar94._0_12_ = auVar92;
      auVar94[0xd] = auVar96[0xd] + auVar60[0xd];
      auVar97[0xe] = auVar96[0xe] + auVar60[0xe];
      auVar97._0_14_ = auVar94;
      auVar97[0xf] = auVar96[0xf] + auVar60[0xf];
      auVar73[0] = (char)(uVar34 >> 4) + cVar65;
      auVar73[1] = (bVar77 >> 4) + bVar77;
      auVar73[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar78;
      auVar73[3] = (bVar79 >> 4) + bVar79;
      auVar73[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar80;
      auVar73[5] = (bVar81 >> 4) + bVar81;
      auVar73[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar82;
      auVar73[7] = (bVar83 >> 4) + bVar83;
      auVar73[8] = (char)(ushort)((unkuint10)auVar92._0_10_ >> 0x44) + cVar84;
      auVar73[9] = (bVar85 >> 4) + bVar85;
      auVar73[10] = (char)(auVar92._10_2_ >> 4) + auVar92[10];
      auVar73[0xb] = (auVar92[0xb] >> 4) + auVar92[0xb];
      auVar73[0xc] = (char)(auVar94._12_2_ >> 4) + auVar94[0xc];
      auVar73[0xd] = (auVar94[0xd] >> 4) + auVar94[0xd];
      auVar73[0xe] = (char)(auVar97._14_2_ >> 4) + auVar97[0xe];
      auVar73[0xf] = (auVar97[0xf] >> 4) + auVar97[0xf];
      auVar56._0_2_ = (ushort)uVar29 >> 1;
      auVar56._2_2_ = (ushort)(uVar29 >> 0x10) >> 1;
      auVar56._4_2_ = (ushort)(uVar29 >> 0x20) >> 1;
      auVar56._6_2_ = (ushort)(uVar29 >> 0x31);
      auVar56._8_2_ = (ushort)uVar27 >> 1;
      auVar56._10_2_ = (ushort)(uVar27 >> 0x10) >> 1;
      auVar56._12_2_ = (ushort)(uVar27 >> 0x20) >> 1;
      auVar56._14_2_ = (ushort)(uVar27 >> 0x31);
      auVar56 = auVar56 & auVar13;
      bVar77 = (char)(uVar29 >> 8) - auVar56[1];
      uVar3 = CONCAT12((char)(uVar29 >> 0x18) - auVar56[3],
                       CONCAT11((char)(uVar29 >> 0x10) - auVar56[2],bVar77));
      uVar4 = CONCAT14((char)(uVar29 >> 0x28) - auVar56[5],
                       CONCAT13((char)(uVar29 >> 0x20) - auVar56[4],uVar3));
      uVar5 = CONCAT16((char)(uVar29 >> 0x38) - auVar56[7],
                       CONCAT15((char)(uVar29 >> 0x30) - auVar56[6],uVar4));
      Var6 = CONCAT18((char)(uVar27 >> 8) - auVar56[9],CONCAT17(-auVar56[8],uVar5));
      auVar8[9] = (char)(uVar27 >> 0x10) - auVar56[10];
      auVar8._0_9_ = Var6;
      auVar8[10] = (char)(uVar27 >> 0x18) - auVar56[0xb];
      auVar10[0xb] = (char)(uVar27 >> 0x20) - auVar56[0xc];
      auVar10._0_11_ = auVar8;
      auVar10[0xc] = (char)(uVar27 >> 0x28) - auVar56[0xd];
      auVar12[0xd] = (char)(uVar27 >> 0x30) - auVar56[0xe];
      auVar12._0_13_ = auVar10;
      auVar12[0xe] = (char)(uVar27 >> 0x38) - auVar56[0xf];
      auVar64[0xf] = 0;
      auVar64._0_15_ = auVar12;
      auVar60 = auVar64 << 8 & auVar14;
      auVar89._0_2_ = (ushort)((ushort)bVar77 << 8) >> 2;
      auVar89._2_2_ = (ushort)((uint3)uVar3 >> 10);
      auVar89._4_2_ = (ushort)((uint5)uVar4 >> 0x1a);
      auVar89._6_2_ = (ushort)((uint7)uVar5 >> 0x2a);
      auVar89._8_2_ = (ushort)((unkuint9)Var6 >> 0x3a);
      auVar89._10_2_ = auVar8._9_2_ >> 2;
      auVar89._12_2_ = auVar10._11_2_ >> 2;
      auVar89._14_2_ = auVar12._13_2_ >> 2;
      auVar89 = auVar89 & auVar14;
      bVar77 = auVar89[1] + auVar60[1];
      uVar34 = CONCAT11(bVar77,auVar89[0]);
      cVar65 = auVar89[2] + auVar60[2];
      bVar79 = auVar89[3] + auVar60[3];
      uVar35 = CONCAT13(bVar79,CONCAT12(cVar65,uVar34));
      cVar78 = auVar89[4] + auVar60[4];
      bVar81 = auVar89[5] + auVar60[5];
      uVar36 = CONCAT15(bVar81,CONCAT14(cVar78,uVar35));
      cVar80 = auVar89[6] + auVar60[6];
      bVar83 = auVar89[7] + auVar60[7];
      uVar37 = CONCAT17(bVar83,CONCAT16(cVar80,uVar36));
      cVar82 = auVar89[8] + auVar60[8];
      bVar85 = auVar89[9] + auVar60[9];
      auVar87._0_10_ = CONCAT19(bVar85,CONCAT18(cVar82,uVar37));
      auVar87[10] = auVar89[10] + auVar60[10];
      auVar87[0xb] = auVar89[0xb] + auVar60[0xb];
      auVar88[0xc] = auVar89[0xc] + auVar60[0xc];
      auVar88._0_12_ = auVar87;
      auVar88[0xd] = auVar89[0xd] + auVar60[0xd];
      auVar90[0xe] = auVar89[0xe] + auVar60[0xe];
      auVar90._0_14_ = auVar88;
      auVar90[0xf] = auVar89[0xf] + auVar60[0xf];
      auVar57[0] = (char)(uVar34 >> 4) + auVar89[0];
      auVar57[1] = (bVar77 >> 4) + bVar77;
      auVar57[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar65;
      auVar57[3] = (bVar79 >> 4) + bVar79;
      auVar57[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar78;
      auVar57[5] = (bVar81 >> 4) + bVar81;
      auVar57[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar80;
      auVar57[7] = (bVar83 >> 4) + bVar83;
      auVar57[8] = (char)(ushort)((unkuint10)auVar87._0_10_ >> 0x44) + cVar82;
      auVar57[9] = (bVar85 >> 4) + bVar85;
      auVar57[10] = (char)(auVar87._10_2_ >> 4) + auVar87[10];
      auVar57[0xb] = (auVar87[0xb] >> 4) + auVar87[0xb];
      auVar57[0xc] = (char)(auVar88._12_2_ >> 4) + auVar88[0xc];
      auVar57[0xd] = (auVar88[0xd] >> 4) + auVar88[0xd];
      auVar57[0xe] = (char)(auVar90._14_2_ >> 4) + auVar90[0xe];
      auVar57[0xf] = (auVar90[0xf] >> 4) + auVar90[0xf];
      auVar64 = psadbw(auVar63,(undefined1  [16])0x0);
      auVar73 = auVar73 & auVar15;
      auVar57 = auVar57 & auVar15;
      auVar58[0] = auVar57[0] + auVar73[0];
      auVar58[1] = auVar57[1] + auVar73[1];
      auVar58[2] = auVar57[2] + auVar73[2];
      auVar58[3] = auVar57[3] + auVar73[3];
      auVar58[4] = auVar57[4] + auVar73[4];
      auVar58[5] = auVar57[5] + auVar73[5];
      auVar58[6] = auVar57[6] + auVar73[6];
      auVar58[7] = auVar57[7] + auVar73[7];
      auVar58[8] = auVar57[8] + auVar73[8];
      auVar58[9] = auVar57[9] + auVar73[9];
      auVar58[10] = auVar57[10] + auVar73[10];
      auVar58[0xb] = auVar57[0xb] + auVar73[0xb];
      auVar58[0xc] = auVar57[0xc] + auVar73[0xc];
      auVar58[0xd] = auVar57[0xd] + auVar73[0xd];
      auVar58[0xe] = auVar57[0xe] + auVar73[0xe];
      auVar58[0xf] = auVar57[0xf] + auVar73[0xf];
      auVar60 = psadbw(auVar58,(undefined1  [16])0x0);
      auVar74._0_2_ = (ushort)uVar32 >> 1;
      auVar74._2_2_ = (ushort)(uVar32 >> 0x10) >> 1;
      auVar74._4_2_ = (ushort)(uVar32 >> 0x20) >> 1;
      auVar74._6_2_ = (ushort)(uVar32 >> 0x31);
      auVar74._8_2_ = (ushort)uVar33 >> 1;
      auVar74._10_2_ = (ushort)(uVar33 >> 0x10) >> 1;
      auVar74._12_2_ = (ushort)(uVar33 >> 0x20) >> 1;
      auVar74._14_2_ = (ushort)(uVar33 >> 0x31);
      auVar74 = auVar74 & auVar13;
      uVar34 = CONCAT11((char)(uVar32 >> 8) - auVar74[1],(char)uVar32 - auVar74[0]);
      uVar35 = CONCAT13((char)(uVar32 >> 0x18) - auVar74[3],
                        CONCAT12((char)(uVar32 >> 0x10) - auVar74[2],uVar34));
      uVar36 = CONCAT15((char)(uVar32 >> 0x28) - auVar74[5],
                        CONCAT14((char)(uVar32 >> 0x20) - auVar74[4],uVar35));
      uVar37 = CONCAT17((char)(uVar32 >> 0x38) - auVar74[7],
                        CONCAT16((char)(uVar32 >> 0x30) - auVar74[6],uVar36));
      auVar39._0_10_ = CONCAT19((char)(uVar33 >> 8) - auVar74[9],CONCAT18(-auVar74[8],uVar37));
      auVar39[10] = (char)(uVar33 >> 0x10) - auVar74[10];
      auVar39[0xb] = (char)(uVar33 >> 0x18) - auVar74[0xb];
      auVar41[0xc] = (char)(uVar33 >> 0x20) - auVar74[0xc];
      auVar41._0_12_ = auVar39;
      auVar41[0xd] = (char)(uVar33 >> 0x28) - auVar74[0xd];
      auVar76[0xe] = (char)(uVar33 >> 0x30) - auVar74[0xe];
      auVar76._0_14_ = auVar41;
      auVar76[0xf] = (char)(uVar33 >> 0x38) - auVar74[0xf];
      auVar53 = auVar76 & auVar14;
      auVar43._0_2_ = uVar34 >> 2;
      auVar43._2_2_ = (ushort)((uint)uVar35 >> 0x12);
      auVar43._4_2_ = (ushort)((uint6)uVar36 >> 0x22);
      auVar43._6_2_ = (ushort)((ulong)uVar37 >> 0x32);
      auVar43._8_2_ = (ushort)((unkuint10)auVar39._0_10_ >> 0x42);
      auVar43._10_2_ = auVar39._10_2_ >> 2;
      auVar43._12_2_ = auVar41._12_2_ >> 2;
      auVar43._14_2_ = auVar76._14_2_ >> 2;
      auVar43 = auVar43 & auVar14;
      cVar65 = auVar43[0] + auVar53[0];
      bVar77 = auVar43[1] + auVar53[1];
      uVar34 = CONCAT11(bVar77,cVar65);
      cVar78 = auVar43[2] + auVar53[2];
      bVar79 = auVar43[3] + auVar53[3];
      uVar35 = CONCAT13(bVar79,CONCAT12(cVar78,uVar34));
      cVar80 = auVar43[4] + auVar53[4];
      bVar81 = auVar43[5] + auVar53[5];
      uVar36 = CONCAT15(bVar81,CONCAT14(cVar80,uVar35));
      cVar82 = auVar43[6] + auVar53[6];
      bVar83 = auVar43[7] + auVar53[7];
      uVar37 = CONCAT17(bVar83,CONCAT16(cVar82,uVar36));
      cVar84 = auVar43[8] + auVar53[8];
      bVar85 = auVar43[9] + auVar53[9];
      auVar40._0_10_ = CONCAT19(bVar85,CONCAT18(cVar84,uVar37));
      auVar40[10] = auVar43[10] + auVar53[10];
      auVar40[0xb] = auVar43[0xb] + auVar53[0xb];
      auVar42[0xc] = auVar43[0xc] + auVar53[0xc];
      auVar42._0_12_ = auVar40;
      auVar42[0xd] = auVar43[0xd] + auVar53[0xd];
      auVar44[0xe] = auVar43[0xe] + auVar53[0xe];
      auVar44._0_14_ = auVar42;
      auVar44[0xf] = auVar43[0xf] + auVar53[0xf];
      auVar75[0] = (char)(uVar34 >> 4) + cVar65;
      auVar75[1] = (bVar77 >> 4) + bVar77;
      auVar75[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar78;
      auVar75[3] = (bVar79 >> 4) + bVar79;
      auVar75[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar80;
      auVar75[5] = (bVar81 >> 4) + bVar81;
      auVar75[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar82;
      auVar75[7] = (bVar83 >> 4) + bVar83;
      auVar75[8] = (char)(ushort)((unkuint10)auVar40._0_10_ >> 0x44) + cVar84;
      auVar75[9] = (bVar85 >> 4) + bVar85;
      auVar75[10] = (char)(auVar40._10_2_ >> 4) + auVar40[10];
      auVar75[0xb] = (auVar40[0xb] >> 4) + auVar40[0xb];
      auVar75[0xc] = (char)(auVar42._12_2_ >> 4) + auVar42[0xc];
      auVar75[0xd] = (auVar42[0xd] >> 4) + auVar42[0xd];
      auVar75[0xe] = (char)(auVar44._14_2_ >> 4) + auVar44[0xe];
      auVar75[0xf] = (auVar44[0xf] >> 4) + auVar44[0xf];
      auVar76 = psadbw(auVar75 & auVar15,(undefined1  [16])0x0);
      lVar38 = auVar76._8_8_ + auVar76._0_8_;
      lVar21 = auVar60._0_8_ + lVar21;
      uVar28 = auVar60._8_8_ + uVar28;
      lVar49 = lVar49 + auVar64._0_8_;
      lVar50 = lVar50 + auVar64._8_8_;
      lVar26 = lVar26 + lVar38;
      uVar45 = uVar45 + auVar64._0_8_;
      uVar46 = uVar46 + auVar64._8_8_;
      uVar47 = uVar47 + auVar60._0_8_;
      uVar48 = uVar48 + auVar60._8_8_;
      uVar25 = uVar25 + lVar38;
      uVar23 = uVar23 + 1;
      uVar16 = this->n_blocks - 1;
    } while (uVar23 < uVar16);
    uVar23 = uVar16 >> 0x19;
    if ((uVar16 & 0x1ffffff) != 0) {
      puVar1 = this->data;
      uVar16 = (ulong)(uint)((int)(uVar16 & 0x1ffffff) << 6);
      *(ulong *)(puVar1 + uVar16 + 0x30 + uVar23 * 0x80000000) = CONCAT44((int)lVar50,(int)lVar49);
      *(int *)(puVar1 + uVar16 + 0x38 + uVar23 * 0x80000000) = (int)lVar21;
      *(int *)(puVar1 + uVar16 + 0x3c + uVar23 * 0x80000000) = (int)lVar26;
      *(ulong *)(puVar1 + uVar16 + uVar23 * 0x80000000) =
           *(long *)(puVar1 + uVar16 + uVar23 * 0x80000000) + (uVar28 & 0x7ff);
      *(ulong *)(puVar1 + uVar16 + 0x10 + uVar23 * 0x80000000) =
           *(long *)(puVar1 + uVar16 + 0x10 + uVar23 * 0x80000000) +
           (ulong)((uint)(uVar28 >> 0xb) & 0x7ff);
      *(ulong *)(puVar1 + uVar16 + 0x20 + uVar23 * 0x80000000) =
           *(long *)(puVar1 + uVar16 + 0x20 + uVar23 * 0x80000000) + (uVar28 >> 0x16 & 0x7ff);
      return;
    }
  }
  ppVar2 = (this->superblock_ranks).super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar2[uVar23].A = uVar45;
  ppVar2[uVar23].C = uVar46;
  ppVar2[uVar23].G = uVar47;
  (&ppVar2[uVar23].G)[1] = uVar48;
  ppVar2[uVar23].T = uVar25;
  *(undefined1 (*) [16])(this->data + uVar23 * 0x80000000 + 0x30) = (undefined1  [16])0x0;
  return;
}

Assistant:

void build_rank_support(){

		p_rank_n superblock_r = {};
		p_rank_n block_r = {};

		for(uint64_t bl = 0; bl < n_blocks-1; ++bl){

			uint64_t superblock_number = bl/BLOCKS_PER_SUPERBLOCK_N;
			uint64_t block_number = bl%BLOCKS_PER_SUPERBLOCK_N;

			if(block_number == 0){

				superblock_ranks[superblock_number]=superblock_r;
				block_r = {};

			}

			set_counters(superblock_number, block_number,block_r);

			p_rank_n local_rank = block_rank(superblock_number, block_number);

			block_r = block_r + local_rank;
			superblock_r = superblock_r + local_rank;

		}

		uint64_t superblock_number = (n_blocks-1)/BLOCKS_PER_SUPERBLOCK_N;
		uint64_t block_number = (n_blocks-1)%BLOCKS_PER_SUPERBLOCK_N;

		if(block_number == 0){

			superblock_ranks[superblock_number]=superblock_r;
			block_r = {};

		}

		set_counters(superblock_number, block_number,block_r);

	}